

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O3

DOMDocumentFragment * __thiscall
xercesc_4_0::DOMRangeImpl::traverseCommonEndContainer
          (DOMRangeImpl *this,DOMNode *startAncestor,int how)

{
  bool bVar1;
  int iVar2;
  DOMRangeImpl *pDVar3;
  XMLSize_t XVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  DOMNode *pDVar5;
  int iVar6;
  DOMRangeImpl *pDVar7;
  DOMRangeImpl *this_00;
  undefined4 extraout_var;
  
  pDVar7 = this;
  if (how == 3) {
    traverseLeftBoundary(this,startAncestor,3);
  }
  else {
    iVar6 = (*(this->fDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[4])();
    pDVar3 = (DOMRangeImpl *)CONCAT44(extraout_var,iVar6);
    pDVar5 = traverseLeftBoundary(this,startAncestor,how);
    if (pDVar3 != (DOMRangeImpl *)0x0) {
      pDVar7 = pDVar3;
      (*((DOMNode *)&pDVar3->super_DOMRange)->_vptr_DOMNode[0x11])(pDVar3,pDVar5);
      bVar1 = false;
      goto LAB_0027bf92;
    }
  }
  bVar1 = true;
  pDVar3 = (DOMRangeImpl *)0x0;
LAB_0027bf92:
  XVar4 = indexOf(pDVar7,startAncestor,this->fEndContainer);
  iVar6 = (int)this->fEndOffset;
  iVar2 = (*startAncestor->_vptr_DOMNode[10])(startAncestor);
  if (0 < (int)(~(uint)XVar4 + iVar6)) {
    iVar6 = iVar6 - (uint)XVar4;
    pDVar7 = (DOMRangeImpl *)CONCAT44(extraout_var_00,iVar2);
    do {
      this_00 = pDVar7;
      iVar2 = (*(pDVar7->super_DOMRange)._vptr_DOMRange[10])();
      pDVar5 = traverseFullySelected(this_00,(DOMNode *)pDVar7,how);
      if (!bVar1) {
        (*((DOMNode *)&pDVar3->super_DOMRange)->_vptr_DOMNode[0x11])(pDVar3,pDVar5);
      }
      iVar6 = iVar6 + -1;
      pDVar7 = (DOMRangeImpl *)CONCAT44(extraout_var_01,iVar2);
    } while (1 < iVar6);
  }
  if (how != 2) {
    (*(this->super_DOMRange)._vptr_DOMRange[0xb])(this,startAncestor);
    (*(this->super_DOMRange)._vptr_DOMRange[0xe])(this,1);
  }
  return (DOMDocumentFragment *)pDVar3;
}

Assistant:

DOMDocumentFragment* DOMRangeImpl::traverseCommonEndContainer( DOMNode*startAncestor, int how )
{
    DOMDocumentFragment* frag = 0;
    if ( how!=DELETE_CONTENTS)
        frag = fDocument->createDocumentFragment();
    DOMNode* n = traverseLeftBoundary( startAncestor, how );
    if ( frag!=0 )
        frag->appendChild( n );
    XMLSize_t startIdx = indexOf( startAncestor, fEndContainer );
    ++startIdx;  // Because we already traversed it....

    int cnt = (int)fEndOffset - (int)startIdx;
    n = startAncestor->getNextSibling();
    while( cnt > 0 )
    {
        DOMNode* sibling = n->getNextSibling();
        DOMNode* xferNode = traverseFullySelected( n, how );
        if ( frag!=0 )
            frag->appendChild( xferNode );
        --cnt;
        n = sibling;
    }

    if ( how != CLONE_CONTENTS )
    {
        setStartAfter( startAncestor );
        collapse( true );
    }

    return frag;
}